

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O0

void __thiscall ByteData_ByteDataConstructor_Test::TestBody(ByteData_ByteDataConstructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_168;
  Message local_160;
  ByteData local_158;
  string local_140;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_f0;
  Message local_e8;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_;
  Message local_c0;
  size_t local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98 [3];
  string local_80;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  ByteData byte_data;
  byte local_2d;
  uint32_t i;
  byte local_28 [3];
  uint8_t byte;
  uint32_t size;
  uint8_t target [20];
  ByteData_ByteDataConstructor_Test *this_local;
  
  i = 0x14;
  local_2d = 1;
  unique0x100006d6 = this;
  for (byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x14;
      byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    local_28[byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] = local_2d;
    local_2d = local_2d + 1;
    if (9 < local_2d) {
      local_2d = 0;
    }
  }
  cfd::core::ByteData::ByteData((ByteData *)&gtest_ar.message_,local_28,0x14);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_80,(ByteData *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_60,"byte_data.GetHex().c_str()",
             "\"0102030405060708090001020304050607080900\"",pcVar2,
             "0102030405060708090001020304050607080900");
  std::__cxx11::string::~string((string *)&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_b8 = cfd::core::ByteData::GetDataSize((ByteData *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
            ((EqHelper<false> *)local_b0,"byte_data.GetDataSize()","size",&local_b8,&i);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  bVar1 = cfd::core::ByteData::IsEmpty((ByteData *)&gtest_ar.message_);
  local_d9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d8,&local_d9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_d8,
               (AssertionResult *)"byte_data.IsEmpty()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  cfd::core::ByteData::Serialize(&local_158,(ByteData *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_140,&local_158);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_120,"byte_data.Serialize().GetHex().c_str()",
             "\"140102030405060708090001020304050607080900\"",pcVar2,
             "140102030405060708090001020304050607080900");
  std::__cxx11::string::~string((string *)&local_140);
  cfd::core::ByteData::~ByteData(&local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ByteData, ByteDataConstructor) {
  uint8_t target[20];
  uint32_t size = 20;
  uint8_t byte = 1;
  for (uint32_t i = 0; i < size; i++) {
    target[i] = byte;
    byte++;
    if (byte > 9) {
      byte = 0;
    }
  }
  ByteData byte_data = ByteData(target, size);

  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "0102030405060708090001020304050607080900");
  EXPECT_EQ(byte_data.GetDataSize(), size);
  EXPECT_FALSE(byte_data.IsEmpty());
  EXPECT_STREQ(
    byte_data.Serialize().GetHex().c_str(),
    "140102030405060708090001020304050607080900");
}